

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb99.c
# Opt level: O1

err_t stb99SeedAdj(stb99_seed *seed)

{
  size_t r;
  undefined1 auVar1 [16];
  bool_t bVar2;
  err_t eVar3;
  long lVar4;
  ushort uVar5;
  size_t *psVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  int iVar22;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  
  bVar2 = memIsValid(seed,0x128);
  if (bVar2 == 0) {
    eVar3 = 0x6d;
  }
  else {
    psVar6 = _ls;
    lVar4 = 0;
    do {
      if (*psVar6 == seed->l) goto LAB_00143460;
      lVar4 = lVar4 + 1;
      psVar6 = psVar6 + 1;
    } while (lVar4 != 10);
    lVar4 = 10;
LAB_00143460:
    eVar3 = 0x20c;
    if (lVar4 != 10) {
      r = _rs[lVar4];
      lVar4 = 4;
      do {
        uVar5 = seed->zi[lVar4 + -4] + 0x117;
        if (uVar5 < 0x118) break;
        bVar7 = lVar4 != 0x22;
        lVar4 = lVar4 + 1;
      } while (bVar7);
      if (uVar5 < 0x118) {
        bVar2 = memIsZero(seed->zi,0x3e);
        auVar1 = _DAT_00160370;
        if (bVar2 == 0) {
          return 0x20c;
        }
        lVar4 = 0;
        auVar8 = _DAT_00160320;
        auVar9 = _DAT_00160330;
        auVar10 = _DAT_00160340;
        auVar11 = _DAT_00160350;
        do {
          auVar12 = auVar11 ^ auVar1;
          auVar23._0_4_ = -(uint)(auVar12._0_4_ < -0x7fffffe1);
          auVar23._4_4_ = -(uint)(auVar12._0_4_ < -0x7fffffe1);
          auVar23._8_4_ = -(uint)(auVar12._8_4_ < -0x7fffffe1);
          auVar23._12_4_ = -(uint)(auVar12._8_4_ < -0x7fffffe1);
          auVar18._0_4_ = -(uint)(auVar12._4_4_ == -0x80000000);
          auVar18._4_4_ = -(uint)(auVar12._4_4_ == -0x80000000);
          auVar18._8_4_ = -(uint)(auVar12._12_4_ == -0x80000000);
          auVar18._12_4_ = -(uint)(auVar12._12_4_ == -0x80000000);
          auVar18 = auVar18 & auVar23;
          auVar12 = pshuflw(auVar23,auVar18,0xe8);
          auVar12 = packssdw(auVar12,auVar12);
          lVar13 = auVar11._8_8_;
          if ((auVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            seed->zi[lVar4] = auVar11._0_2_ + 1;
          }
          auVar12 = packssdw(auVar18,auVar18);
          auVar12 = packssdw(auVar12,auVar12);
          if ((auVar12._0_4_ >> 0x10 & 1) != 0) {
            seed->zi[lVar4 + 1] = auVar11._8_2_ + 1;
          }
          lVar14 = auVar10._8_8_;
          auVar12 = auVar10 ^ auVar1;
          iVar17 = auVar12._0_4_;
          iVar22 = auVar12._8_4_;
          auVar24._4_4_ = iVar17;
          auVar24._0_4_ = iVar17;
          auVar24._8_4_ = iVar22;
          auVar24._12_4_ = iVar22;
          auVar27._0_4_ = -(uint)(iVar17 < -0x7fffffe1);
          auVar27._4_4_ = -(uint)(iVar17 < -0x7fffffe1);
          auVar27._8_4_ = -(uint)(iVar22 < -0x7fffffe1);
          auVar27._12_4_ = -(uint)(iVar22 < -0x7fffffe1);
          auVar19._0_4_ = -(uint)(auVar12._4_4_ == -0x80000000);
          auVar19._4_4_ = -(uint)(auVar12._4_4_ == -0x80000000);
          auVar19._8_4_ = -(uint)(auVar12._12_4_ == -0x80000000);
          auVar19._12_4_ = -(uint)(auVar12._12_4_ == -0x80000000);
          auVar19 = auVar19 & auVar27;
          auVar12 = packssdw(auVar24,auVar19);
          auVar12 = packssdw(auVar12,auVar12);
          if ((auVar12 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            seed->zi[lVar4 + 2] = auVar10._0_2_ + 1;
          }
          auVar12 = pshufhw(auVar19,auVar19,0x84);
          auVar12 = packssdw(auVar12,auVar12);
          if ((auVar12 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            seed->zi[lVar4 + 3] = auVar10._8_2_ + 1;
          }
          lVar15 = auVar9._8_8_;
          auVar12 = auVar9 ^ auVar1;
          iVar17 = auVar12._0_4_;
          iVar22 = auVar12._8_4_;
          auVar25._4_4_ = iVar17;
          auVar25._0_4_ = iVar17;
          auVar25._8_4_ = iVar22;
          auVar25._12_4_ = iVar22;
          auVar28._0_4_ = -(uint)(iVar17 < -0x7fffffe1);
          auVar28._4_4_ = -(uint)(iVar17 < -0x7fffffe1);
          auVar28._8_4_ = -(uint)(iVar22 < -0x7fffffe1);
          auVar28._12_4_ = -(uint)(iVar22 < -0x7fffffe1);
          auVar20._0_4_ = -(uint)(auVar12._4_4_ == -0x80000000);
          auVar20._4_4_ = -(uint)(auVar12._4_4_ == -0x80000000);
          auVar20._8_4_ = -(uint)(auVar12._12_4_ == -0x80000000);
          auVar20._12_4_ = -(uint)(auVar12._12_4_ == -0x80000000);
          auVar20 = auVar20 & auVar28;
          auVar12 = pshuflw(auVar25,auVar20,0xe8);
          auVar12 = packssdw(auVar12,auVar12);
          if ((auVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            seed->zi[lVar4 + 4] = auVar9._0_2_ + 1;
          }
          auVar12 = packssdw(auVar20,auVar20);
          auVar12 = packssdw(auVar12,auVar12);
          if ((auVar12 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            seed->zi[lVar4 + 5] = auVar9._8_2_ + 1;
          }
          lVar16 = auVar8._8_8_;
          auVar12 = auVar8 ^ auVar1;
          iVar17 = auVar12._0_4_;
          iVar22 = auVar12._8_4_;
          auVar26._4_4_ = iVar17;
          auVar26._0_4_ = iVar17;
          auVar26._8_4_ = iVar22;
          auVar26._12_4_ = iVar22;
          auVar29._0_4_ = -(uint)(iVar17 < -0x7fffffe1);
          auVar29._4_4_ = -(uint)(iVar17 < -0x7fffffe1);
          auVar29._8_4_ = -(uint)(iVar22 < -0x7fffffe1);
          auVar29._12_4_ = -(uint)(iVar22 < -0x7fffffe1);
          auVar21._0_4_ = -(uint)(auVar12._4_4_ == -0x80000000);
          auVar21._4_4_ = -(uint)(auVar12._4_4_ == -0x80000000);
          auVar21._8_4_ = -(uint)(auVar12._12_4_ == -0x80000000);
          auVar21._12_4_ = -(uint)(auVar12._12_4_ == -0x80000000);
          auVar21 = auVar21 & auVar29;
          auVar12 = packssdw(auVar26,auVar21);
          auVar12 = packssdw(auVar12,auVar12);
          if ((auVar12 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            seed->zi[lVar4 + 6] = auVar8._0_2_ + 1;
          }
          auVar12 = pshufhw(auVar21,auVar21,0x84);
          auVar12 = packssdw(auVar12,auVar12);
          if ((auVar12 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            seed->zi[lVar4 + 7] = auVar8._8_2_ + 1;
          }
          lVar4 = lVar4 + 8;
          auVar11._0_8_ = auVar11._0_8_ + 8;
          auVar11._8_8_ = lVar13 + 8;
          auVar10._0_8_ = auVar10._0_8_ + 8;
          auVar10._8_8_ = lVar14 + 8;
          auVar9._0_8_ = auVar9._0_8_ + 8;
          auVar9._8_8_ = lVar15 + 8;
          auVar8._0_8_ = auVar8._0_8_ + 8;
          auVar8._8_8_ = lVar16 + 8;
        } while (lVar4 != 0x20);
      }
      eVar3 = stb99DiVal(seed,r);
      if (eVar3 != 0) {
        bVar2 = memIsZero(seed->di,0x90);
        if (bVar2 == 0) {
          return 0x20c;
        }
        seed->di[0] = (seed->l >> 1) + 1;
        psVar6 = seed->di;
        do {
          psVar6 = psVar6 + 1;
          *psVar6 = (psVar6[-1] >> 1) + 1;
        } while (0x3f < psVar6[-1]);
      }
      eVar3 = stb99RiVal(seed,r);
      if (eVar3 != 0) {
        bVar2 = memIsZero(seed->ri,0x50);
        if (bVar2 == 0) {
          return 0x20c;
        }
        seed->ri[0] = r;
        psVar6 = seed->ri;
        do {
          psVar6 = psVar6 + 1;
          *psVar6 = (psVar6[-1] >> 1) + 1;
        } while (0x3f < psVar6[-1]);
      }
      eVar3 = 0;
    }
  }
  return eVar3;
}

Assistant:

err_t stb99SeedAdj(stb99_seed* seed)
{
	size_t i;
	size_t r;
	// проверить указатели
	if (!memIsValid(seed, sizeof(stb99_seed)))
		return ERR_BAD_INPUT;
	// проверить l
	for (i = 0; i < COUNT_OF(_ls); ++i)
		if (_ls[i] == seed->l)
			break;
	if (i == COUNT_OF(_ls))
		return ERR_BAD_SEED;
	// определить r = r(l)
	r = _rs[i];
	// проверить zi
	if (stb99ZiVal(seed) != ERR_OK)
	{
		if (!memIsZero(seed->zi, sizeof(seed->zi)))
			return ERR_BAD_SEED;
		for (i = 0; i < 31; ++i)
			seed->zi[i] = (u16)(i + 1);
	}
	// проверить цепочку di
	if (stb99DiVal(seed, r) != ERR_OK)
	{
		if (!memIsZero(seed->di, sizeof(seed->di)))
			return ERR_BAD_SEED;
		seed->di[0] = seed->l / 2 + 1;
		for (i = 1; (seed->di[i] = seed->di[i - 1] / 2 + 1) > 32; ++i);
		ASSERT(seed->di[i] > 16);
	}
	// проверить цепочку ri
	if (stb99RiVal(seed, r) != ERR_OK)
	{
		if (!memIsZero(seed->ri, sizeof(seed->ri)))
			return ERR_BAD_SEED;
		seed->ri[0] = r;
		for (i = 1; (seed->ri[i] = seed->ri[i - 1] / 2 + 1) > 32; ++i);
		ASSERT(seed->ri[i] > 16);
	}
	return ERR_OK;
}